

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_edit.cc
# Opt level: O2

Status __thiscall leveldb::VersionEdit::DecodeFrom(VersionEdit *this,Slice *src)

{
  bool bVar1;
  bool bVar2;
  undefined8 *in_RDX;
  char *__s;
  long in_FS_OFFSET;
  Status *result;
  Slice str;
  uint64_t number;
  int level;
  uint32_t tag;
  Slice input;
  InternalKey key;
  FileMetaData f;
  Slice local_160;
  _Alloc_hider local_150;
  Slice local_148;
  pointer local_138;
  int local_130;
  uint32_t local_12c;
  Slice local_128;
  undefined1 local_110 [8];
  _Alloc_hider local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  FileMetaData local_90;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  Clear((VersionEdit *)src);
  local_128.data_ = (char *)*in_RDX;
  local_128.size_ = in_RDX[1];
  local_90.refs = 0;
  local_90.allowed_seeks = 0x40000000;
  local_90.file_size = 0;
  local_90.smallest.rep_._M_dataplus._M_p = (pointer)&local_90.smallest.rep_.field_2;
  local_90.smallest.rep_._M_string_length = 0;
  __s = (char *)0x0;
  local_90.smallest.rep_.field_2._M_local_buf[0] = '\0';
  local_90.largest.rep_._M_dataplus._M_p = (pointer)&local_90.largest.rep_.field_2;
  local_90.largest.rep_._M_string_length = 0;
  local_90.largest.rep_.field_2._M_local_buf[0] = '\0';
  local_148.data_ = "";
  local_148.size_ = 0;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  bVar1 = true;
switchD_0054b7f3_caseD_8:
  if (!bVar1) {
LAB_0054bacd:
    (this->comparator_)._M_dataplus._M_p = (pointer)0x0;
    local_110 = (undefined1  [8])0x713df1;
    local_108._M_p = (pointer)0xb;
    local_160.data_ = __s;
    local_160.size_ = strlen(__s);
    Status::Corruption((Status *)&local_150,(Slice *)local_110,&local_160);
    (this->comparator_)._M_dataplus._M_p = local_150._M_p;
    local_150._M_p = (pointer)0x0;
    Status::~Status((Status *)&local_150);
LAB_0054bb25:
    std::__cxx11::string::~string((string *)&local_b0);
    FileMetaData::~FileMetaData(&local_90);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return (Status)(char *)this;
    }
    __stack_chk_fail();
  }
  bVar1 = GetVarint32(&local_128,&local_12c);
  if (!bVar1) {
    if (local_128.size_ == 0) {
      (this->comparator_)._M_dataplus._M_p = (pointer)0x0;
      goto LAB_0054bb25;
    }
    __s = "invalid tag";
    goto LAB_0054bacd;
  }
  bVar1 = false;
  __s = "unknown tag";
  switch(local_12c) {
  case 1:
    bVar2 = GetLengthPrefixedSlice(&local_128,&local_148);
    bVar1 = false;
    __s = "comparator name";
    if (!bVar2) goto switchD_0054b7f3_caseD_8;
    Slice::ToString_abi_cxx11_((string *)local_110,&local_148);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)src,
               (string *)local_110);
    std::__cxx11::string::~string((string *)local_110);
    *(undefined1 *)&src[4].data_ = 1;
    break;
  case 2:
    bVar2 = GetVarint64(&local_128,(uint64_t *)(src + 2));
    bVar1 = false;
    __s = "log number";
    if (!bVar2) goto switchD_0054b7f3_caseD_8;
    *(undefined1 *)((long)&src[4].data_ + 1) = 1;
    break;
  case 3:
    bVar2 = GetVarint64(&local_128,(uint64_t *)(src + 3));
    bVar1 = false;
    __s = "next file number";
    if (!bVar2) goto switchD_0054b7f3_caseD_8;
    *(undefined1 *)((long)&src[4].data_ + 3) = 1;
    break;
  case 4:
    bVar2 = GetVarint64(&local_128,&src[3].size_);
    bVar1 = false;
    __s = "last sequence number";
    if (!bVar2) goto switchD_0054b7f3_caseD_8;
    *(undefined1 *)((long)&src[4].data_ + 4) = 1;
    break;
  case 5:
    bVar2 = GetLevel(&local_128,&local_130);
    bVar1 = false;
    __s = "compaction pointer";
    if (!bVar2) goto switchD_0054b7f3_caseD_8;
    bVar2 = GetInternalKey(&local_128,(InternalKey *)&local_b0);
    bVar1 = false;
    __s = "compaction pointer";
    if (!bVar2) goto switchD_0054b7f3_caseD_8;
    local_110._0_4_ = local_130;
    std::__cxx11::string::string((string *)&local_108,&local_b0);
    std::
    vector<std::pair<int,leveldb::InternalKey>,std::allocator<std::pair<int,leveldb::InternalKey>>>
    ::emplace_back<std::pair<int,leveldb::InternalKey>>
              ((vector<std::pair<int,leveldb::InternalKey>,std::allocator<std::pair<int,leveldb::InternalKey>>>
                *)&src[4].size_,(pair<int,_leveldb::InternalKey> *)local_110);
    std::__cxx11::string::~string((string *)&local_108);
    break;
  case 6:
    bVar2 = GetLevel(&local_128,&local_130);
    bVar1 = false;
    __s = "deleted file";
    if (!bVar2) goto switchD_0054b7f3_caseD_8;
    bVar2 = GetVarint64(&local_128,(uint64_t *)&local_138);
    bVar1 = false;
    __s = "deleted file";
    if (!bVar2) goto switchD_0054b7f3_caseD_8;
    local_110._0_4_ = local_130;
    local_108._M_p = local_138;
    std::
    _Rb_tree<std::pair<int,unsigned_long>,std::pair<int,unsigned_long>,std::_Identity<std::pair<int,unsigned_long>>,std::less<std::pair<int,unsigned_long>>,std::allocator<std::pair<int,unsigned_long>>>
    ::_M_insert_unique<std::pair<int,unsigned_long>>
              ((_Rb_tree<std::pair<int,unsigned_long>,std::pair<int,unsigned_long>,std::_Identity<std::pair<int,unsigned_long>>,std::less<std::pair<int,unsigned_long>>,std::allocator<std::pair<int,unsigned_long>>>
                *)(src + 6),(pair<int,_unsigned_long> *)local_110);
    break;
  case 7:
    bVar2 = GetLevel(&local_128,&local_130);
    bVar1 = false;
    __s = "new-file entry";
    if (!bVar2) goto switchD_0054b7f3_caseD_8;
    bVar2 = GetVarint64(&local_128,&local_90.number);
    bVar1 = false;
    __s = "new-file entry";
    if (!bVar2) goto switchD_0054b7f3_caseD_8;
    bVar2 = GetVarint64(&local_128,&local_90.file_size);
    bVar1 = false;
    __s = "new-file entry";
    if (!bVar2) goto switchD_0054b7f3_caseD_8;
    bVar2 = GetInternalKey(&local_128,&local_90.smallest);
    bVar1 = false;
    __s = "new-file entry";
    if (!bVar2) goto switchD_0054b7f3_caseD_8;
    bVar2 = GetInternalKey(&local_128,&local_90.largest);
    bVar1 = false;
    __s = "new-file entry";
    if (!bVar2) goto switchD_0054b7f3_caseD_8;
    local_110._0_4_ = local_130;
    FileMetaData::FileMetaData((FileMetaData *)&local_108,&local_90);
    std::
    vector<std::pair<int,leveldb::FileMetaData>,std::allocator<std::pair<int,leveldb::FileMetaData>>>
    ::emplace_back<std::pair<int,leveldb::FileMetaData>>
              ((vector<std::pair<int,leveldb::FileMetaData>,std::allocator<std::pair<int,leveldb::FileMetaData>>>
                *)(src + 9),(pair<int,_leveldb::FileMetaData> *)local_110);
    FileMetaData::~FileMetaData((FileMetaData *)&local_108);
    break;
  default:
    goto switchD_0054b7f3_caseD_8;
  case 9:
    bVar2 = GetVarint64(&local_128,&src[2].size_);
    bVar1 = false;
    __s = "previous log number";
    if (!bVar2) goto switchD_0054b7f3_caseD_8;
    *(undefined1 *)((long)&src[4].data_ + 2) = 1;
  }
  bVar1 = true;
  __s = (char *)0x0;
  goto switchD_0054b7f3_caseD_8;
}

Assistant:

Status VersionEdit::DecodeFrom(const Slice& src) {
  Clear();
  Slice input = src;
  const char* msg = nullptr;
  uint32_t tag;

  // Temporary storage for parsing
  int level;
  uint64_t number;
  FileMetaData f;
  Slice str;
  InternalKey key;

  while (msg == nullptr && GetVarint32(&input, &tag)) {
    switch (tag) {
      case kComparator:
        if (GetLengthPrefixedSlice(&input, &str)) {
          comparator_ = str.ToString();
          has_comparator_ = true;
        } else {
          msg = "comparator name";
        }
        break;

      case kLogNumber:
        if (GetVarint64(&input, &log_number_)) {
          has_log_number_ = true;
        } else {
          msg = "log number";
        }
        break;

      case kPrevLogNumber:
        if (GetVarint64(&input, &prev_log_number_)) {
          has_prev_log_number_ = true;
        } else {
          msg = "previous log number";
        }
        break;

      case kNextFileNumber:
        if (GetVarint64(&input, &next_file_number_)) {
          has_next_file_number_ = true;
        } else {
          msg = "next file number";
        }
        break;

      case kLastSequence:
        if (GetVarint64(&input, &last_sequence_)) {
          has_last_sequence_ = true;
        } else {
          msg = "last sequence number";
        }
        break;

      case kCompactPointer:
        if (GetLevel(&input, &level) && GetInternalKey(&input, &key)) {
          compact_pointers_.push_back(std::make_pair(level, key));
        } else {
          msg = "compaction pointer";
        }
        break;

      case kDeletedFile:
        if (GetLevel(&input, &level) && GetVarint64(&input, &number)) {
          deleted_files_.insert(std::make_pair(level, number));
        } else {
          msg = "deleted file";
        }
        break;

      case kNewFile:
        if (GetLevel(&input, &level) && GetVarint64(&input, &f.number) &&
            GetVarint64(&input, &f.file_size) &&
            GetInternalKey(&input, &f.smallest) &&
            GetInternalKey(&input, &f.largest)) {
          new_files_.push_back(std::make_pair(level, f));
        } else {
          msg = "new-file entry";
        }
        break;

      default:
        msg = "unknown tag";
        break;
    }
  }

  if (msg == nullptr && !input.empty()) {
    msg = "invalid tag";
  }

  Status result;
  if (msg != nullptr) {
    result = Status::Corruption("VersionEdit", msg);
  }
  return result;
}